

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool_task.cpp
# Opt level: O2

void __thiscall
Function_Pool::FunctionPoolTask::_setup
          (FunctionPoolTask *this,Image *in1,uint32_t startX1,uint32_t startY1,Image *in2,
          uint32_t startX2,uint32_t startY2,Image *out,uint32_t startXOut,uint32_t startYOut,
          uint32_t width,uint32_t height)

{
  bool bVar1;
  uint32_t uVar2;
  pointer pIVar3;
  pointer __p_00;
  imageException *this_00;
  pointer __p;
  pointer __p_1;
  __uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
  local_40;
  Image *local_38;
  
  local_38 = in2;
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in1,startX1,startY1,in2,startX2,startY2,out,startXOut,startYOut,width,height);
  bVar1 = AbstractTaskProvider::_ready((AbstractTaskProvider *)this);
  if (bVar1) {
    pIVar3 = (pointer)operator_new(0x68);
    uVar2 = anon_unknown.dwarf_42020::threadCount();
    AreaInfo::AreaInfo((AreaInfo *)pIVar3,startX1,startY1,width,height,uVar2);
    pIVar3->image = in1;
    local_40._M_t.
    super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
    .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl =
         (tuple<Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
          )(_Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
            )0x0;
    std::
    __uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
    ::reset((__uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             *)&this->_infoIn1,pIVar3);
    std::
    unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
    ~unique_ptr((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                 *)&local_40);
    pIVar3 = (pointer)operator_new(0x68);
    uVar2 = anon_unknown.dwarf_42020::threadCount();
    AreaInfo::AreaInfo((AreaInfo *)pIVar3,startX2,startY2,width,height,uVar2);
    local_40._M_t.
    super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
    .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl =
         (tuple<Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
          )(_Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
            )0x0;
    pIVar3->image = local_38;
    std::
    __uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
    ::reset((__uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
             *)&this->_infoIn2,pIVar3);
    std::
    unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>::
    ~unique_ptr((unique_ptr<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
                 *)&local_40);
    __p_00 = (pointer)operator_new(0x68);
    uVar2 = anon_unknown.dwarf_42020::threadCount();
    AreaInfo::AreaInfo((AreaInfo *)__p_00,startXOut,startYOut,width,height,uVar2);
    local_40._M_t.
    super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
    .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl =
         (tuple<Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
          )(_Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
            )0x0;
    __p_00->image = out;
    std::
    __uniq_ptr_impl<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
    ::reset((__uniq_ptr_impl<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
             *)&this->_infoOut,__p_00);
    std::
    unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
    ::~unique_ptr((unique_ptr<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
                   *)&local_40);
    return;
  }
  this_00 = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this_00,"FunctionTask object was called multiple times!");
  __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void FunctionPoolTask::_setup( const Image & in1, uint32_t startX1, uint32_t startY1, const Image & in2, uint32_t startX2, uint32_t startY2,
                                   Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t width, uint32_t height )
    {
        Image_Function::ParameterValidation( in1, startX1, startY1, in2, startX2, startY2, out, startXOut, startYOut, width, height );

        if( !_ready() )
            throw imageException( "FunctionTask object was called multiple times!" );

        _infoIn1 = std::unique_ptr < InputImageInfo  >( new InputImageInfo ( in1, startX1, startY1, width, height, threadCount() ) );
        _infoIn2 = std::unique_ptr < InputImageInfo  >( new InputImageInfo ( in2, startX2, startY2, width, height, threadCount() ) );
        _infoOut = std::unique_ptr < OutputImageInfo >( new OutputImageInfo( out, startXOut, startYOut, width, height, threadCount() ) );
    }